

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

bool __thiscall
SslTcpSocketImpl::Connect(SslTcpSocketImpl *this,char *szIpToWhere,uint16_t sPort,int AddrHint)

{
  SslConnection *this_00;
  undefined8 __p;
  bool bVar1;
  undefined1 local_88 [48];
  SslTcpSocketImpl *local_58;
  function<void_(TcpSocketImpl_*)> local_50;
  
  std::make_unique<OpenSSLWrapper::SslConnection,OpenSSLWrapper::SslClientContext&>
            ((SslClientContext *)local_88);
  __p = local_88._0_8_;
  local_88._0_8_ = (_func_int **)0x0;
  std::
  __uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
  ::reset((__uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           *)&this->m_pSslCon,(pointer)__p);
  std::
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
  ~unique_ptr((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               *)local_88);
  this_00 = (this->m_pSslCon)._M_t.
            super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
            ._M_t.
            super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
            .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl;
  local_88._32_8_ = 0x11;
  local_88._40_8_ = 0;
  local_58 = this;
  std::function<void()>::function<std::_Bind<void(BaseSocketImpl::*(SslTcpSocketImpl*))()>,void>
            ((function<void()> *)local_88,
             (_Bind<void_(BaseSocketImpl::*(SslTcpSocketImpl_*))()> *)(local_88 + 0x20));
  OpenSSLWrapper::SslConnection::SetErrorCb(this_00,(function<void_()> *)local_88);
  std::_Function_base::~_Function_base((_Function_base *)local_88);
  OpenSSLWrapper::SslConnection::SetUserData
            ((this->m_pSslCon)._M_t.
             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,0,
             fnForwarder_abi_cxx11_);
  OpenSSLWrapper::SslConnection::SetUserData
            ((this->m_pSslCon)._M_t.
             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,1,this);
  OpenSSLWrapper::SslConnection::SetSniName
            ((this->m_pSslCon)._M_t.
             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,szIpToWhere
            );
  if ((this->m_vProtoList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_vProtoList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    OpenSSLWrapper::SslConnection::SetAlpnProtokollNames
              ((this->m_pSslCon)._M_t.
               super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,
               &this->m_vProtoList);
  }
  if ((this->m_strTrustRootCert)._M_string_length != 0) {
    OpenSSLWrapper::SslConnection::SetTrustedRootCertificates
              ((this->m_pSslCon)._M_t.
               super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,
               (this->m_strTrustRootCert)._M_dataplus._M_p);
  }
  local_88._0_8_ = ConEstablished;
  local_88._8_8_ = (SSL_CTX *)0x0;
  local_88._16_8_ = this;
  std::function<void(TcpSocketImpl*)>::
  function<std::_Bind<void(SslTcpSocketImpl::*(SslTcpSocketImpl*,std::_Placeholder<1>))(TcpSocketImpl_const*)>,void>
            ((function<void(TcpSocketImpl*)> *)&local_50,
             (_Bind<void_(SslTcpSocketImpl::*(SslTcpSocketImpl_*,_std::_Placeholder<1>))(const_TcpSocketImpl_*)>
              *)local_88);
  TcpSocketImpl::BindFuncConEstablished(&this->super_TcpSocketImpl,&local_50);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  bVar1 = TcpSocketImpl::Connect(&this->super_TcpSocketImpl,szIpToWhere,sPort,AddrHint);
  return bVar1;
}

Assistant:

bool SslTcpSocketImpl::Connect(const char* const szIpToWhere, const uint16_t sPort, const int AddrHint/* = AF_UNSPEC*/)
{
    m_pSslCon = make_unique<SslConnection>(m_pClientCtx);
    m_pSslCon->SetErrorCb(function<void()>(bind(&BaseSocketImpl::Close, this)));
    m_pSslCon->SetUserData(0, reinterpret_cast<void*>(&SslTcpSocketImpl::fnForwarder));
    m_pSslCon->SetUserData(1, this);

    m_pSslCon->SetSniName(szIpToWhere);

    if (m_vProtoList.size() > 0)
        m_pSslCon->SetAlpnProtokollNames(m_vProtoList);
    if (m_strTrustRootCert.size() > 0)
        m_pSslCon->SetTrustedRootCertificates(m_strTrustRootCert.c_str());

    TcpSocketImpl::BindFuncConEstablished(bind(&SslTcpSocketImpl::ConEstablished, this, _1));
    return TcpSocketImpl::Connect(szIpToWhere, sPort, AddrHint);
}